

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsIterationResult
helicsFederateEnterExecutingModeIterative
          (HelicsFederate fed,HelicsIterationRequest iterate,HelicsError *err)

{
  IterationResult iterationState;
  Federate *pFVar1;
  HelicsIterationRequest in_ESI;
  IterationResult val;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  pFVar1 = getFed((HelicsFederate)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8);
  if (pFVar1 == (Federate *)0x0) {
    local_4 = HELICS_ITERATION_RESULT_ERROR;
  }
  else {
    anon_unknown.dwarf_4e9a2::getIterationRequest(in_ESI);
    iterationState = helics::Federate::enterExecutingMode((Federate *)err,fedObj._7_1_);
    local_4 = anon_unknown.dwarf_4e9a2::getIterationStatus(iterationState);
  }
  return local_4;
}

Assistant:

HelicsIterationResult helicsFederateEnterExecutingModeIterative(HelicsFederate fed, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_ITERATION_RESULT_ERROR;
    }
    try {
        auto val = fedObj->enterExecutingMode(getIterationRequest(iterate));
        return getIterationStatus(val);
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_ITERATION_RESULT_ERROR;
    }
}